

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeAddedConstants.cpp
# Opt level: O3

void __thiscall wasm::OptimizeAddedConstants::visitStore(OptimizeAddedConstants *this,Store *curr)

{
  bool bVar1;
  Memory *pMVar2;
  undefined1 local_40 [8];
  MemoryAccessOptimizer<wasm::OptimizeAddedConstants,_wasm::Store> optimizer;
  
  optimizer.curr =
       (Store *)(this->
                super_WalkerPass<wasm::PostWalker<wasm::OptimizeAddedConstants,_wasm::UnifiedExpressionVisitor<wasm::OptimizeAddedConstants,_void>_>_>
                ).
                super_PostWalker<wasm::OptimizeAddedConstants,_wasm::UnifiedExpressionVisitor<wasm::OptimizeAddedConstants,_void>_>
                .
                super_Walker<wasm::OptimizeAddedConstants,_wasm::UnifiedExpressionVisitor<wasm::OptimizeAddedConstants,_void>_>
                .currModule;
  optimizer.module =
       (Module *)
       (this->localGraph)._M_t.
       super___uniq_ptr_impl<wasm::LazyLocalGraph,_std::default_delete<wasm::LazyLocalGraph>_>._M_t.
       super__Tuple_impl<0UL,_wasm::LazyLocalGraph_*,_std::default_delete<wasm::LazyLocalGraph>_>.
       super__Head_base<0UL,_wasm::LazyLocalGraph_*,_false>._M_head_impl;
  local_40 = (undefined1  [8])this;
  optimizer.parent = (OptimizeAddedConstants *)curr;
  pMVar2 = Module::getMemory((Module *)optimizer.curr,(Name)(curr->memory).super_IString.str);
  optimizer.localGraph._0_1_ = (pMVar2->addressType).id == 3;
  bVar1 = MemoryAccessOptimizer<wasm::OptimizeAddedConstants,_wasm::Store>::optimize
                    ((MemoryAccessOptimizer<wasm::OptimizeAddedConstants,_wasm::Store> *)local_40);
  if (bVar1) {
    this->propagated = true;
  }
  return;
}

Assistant:

void visitStore(Store* curr) {
    MemoryAccessOptimizer<OptimizeAddedConstants, Store> optimizer(
      this, curr, getModule(), localGraph.get());
    if (optimizer.optimize()) {
      propagated = true;
    }
  }